

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RollingBuffer_p.cpp
# Opt level: O2

void __thiscall BamTools::Internal::RollingBuffer::RollingBuffer(RollingBuffer *this,size_t growth)

{
  ByteArray BStack_28;
  
  this->m_bufferGrowth = growth;
  std::_Deque_base<BamTools::Internal::ByteArray,_std::allocator<BamTools::Internal::ByteArray>_>::
  _Deque_base(&(this->m_data).
               super__Deque_base<BamTools::Internal::ByteArray,_std::allocator<BamTools::Internal::ByteArray>_>
             );
  ByteArray::ByteArray(&BStack_28);
  std::deque<BamTools::Internal::ByteArray,_std::allocator<BamTools::Internal::ByteArray>_>::
  emplace_back<BamTools::Internal::ByteArray>(&this->m_data,&BStack_28);
  ByteArray::~ByteArray(&BStack_28);
  Clear(this);
  return;
}

Assistant:

RollingBuffer::RollingBuffer(std::size_t growth)
    : m_bufferGrowth(growth)
{
    // buffer always contains at least 1 (maybe empty) byte array
    m_data.push_back(ByteArray());

    // set cleared state
    Clear();
}